

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<StatementAstNode>_> * __thiscall
Parser::parseAssignOrExpressionStatement
          (optional<std::shared_ptr<StatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  undefined1 local_48 [24];
  
  TokenBuffer::currentToken((TokenBuffer *)local_48);
  iVar1 = *(int *)&(((shared_ptr<ExpressionAstNode> *)(local_48._0_8_ + 0x18))->
                   super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                   _M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  if (iVar1 == 0x18) {
    do {
      TokenBuffer::tokenAt
                ((TokenBuffer *)local_48,
                 (size_t)(this->tokenBuffer).
                         super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar1 = *(int *)&(((shared_ptr<ExpressionAstNode> *)(local_48._0_8_ + 0x18))->
                       super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    } while (iVar1 == 4);
    TokenBuffer::tokenAt
              ((TokenBuffer *)local_48,
               (size_t)(this->tokenBuffer).
                       super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar1 = *(int *)&(((shared_ptr<ExpressionAstNode> *)(local_48._0_8_ + 0x18))->
                     super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                     _M_pi;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    if (iVar1 == 0x12) {
      parseAssignStatement((optional<std::shared_ptr<AssignStatementAstNode>_> *)local_48,this);
      std::optional<std::shared_ptr<StatementAstNode>_>::
      optional<std::shared_ptr<AssignStatementAstNode>,_true>
                (__return_storage_ptr__,
                 (optional<std::shared_ptr<AssignStatementAstNode>_> *)local_48);
      std::_Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>::_M_reset
                ((_Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_> *)local_48);
      return __return_storage_ptr__;
    }
    parseExpressionStatement
              ((optional<std::shared_ptr<ExpressionStatementAstNode>_> *)local_48,this);
  }
  else {
    parseExpressionStatement
              ((optional<std::shared_ptr<ExpressionStatementAstNode>_> *)local_48,this);
  }
  std::optional<std::shared_ptr<StatementAstNode>_>::
  optional<std::shared_ptr<ExpressionStatementAstNode>,_true>
            (__return_storage_ptr__,
             (optional<std::shared_ptr<ExpressionStatementAstNode>_> *)local_48);
  std::_Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionStatementAstNode>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<StatementAstNode>>
Parser::parseAssignOrExpressionStatement() noexcept {

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::Identifier) {
    return this->parseExpressionStatement();
  }

  std::size_t lookAhead = 1;
  while (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::WhiteSpace) {
    lookAhead++;
  }

  if (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::Assign) {
    return this->parseAssignStatement();
  }

  return this->parseExpressionStatement();
}